

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnTuple::ColumnTuple
          (ColumnTuple *this,
          vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
          *columns)

{
  vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
  *in_RDI;
  vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
  *unaff_retaddr;
  TypeRef *in_stack_ffffffffffffffb8;
  Column *in_stack_ffffffffffffffc0;
  vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
  *in_stack_ffffffffffffffe8;
  vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
  *__x;
  
  __x = in_RDI;
  CollectTypes(in_RDI);
  Type::CreateTuple(in_stack_ffffffffffffffe8);
  Column::Column(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x23a2e6);
  std::
  vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>::
  ~vector((vector<std::shared_ptr<clickhouse::Type>,_std::allocator<std::shared_ptr<clickhouse::Type>_>_>
           *)in_stack_ffffffffffffffc0);
  (in_RDI->
  super__Vector_base<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ColumnTuple_002a07e8;
  std::
  vector<std::shared_ptr<clickhouse::Column>,_std::allocator<std::shared_ptr<clickhouse::Column>_>_>
  ::vector(unaff_retaddr,__x);
  return;
}

Assistant:

ColumnTuple::ColumnTuple(const std::vector<ColumnRef>& columns)
    : Column(Type::CreateTuple(CollectTypes(columns)))
    , columns_(columns)
{
}